

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.h
# Opt level: O2

TreeEPSubTree * __thiscall
libDAI::TreeEP::TreeEPSubTree::operator=(TreeEPSubTree *this,TreeEPSubTree *x)

{
  if (this != x) {
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator=
              (&this->_Qa,&x->_Qa);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator=
              (&this->_Qb,&x->_Qb);
    std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator=(&this->_RTree,&x->_RTree);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->_a,&x->_a);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->_b,&x->_b);
    this->_I = x->_I;
    VarSet::operator=(&this->_ns,&x->_ns);
    VarSet::operator=(&this->_nsrem,&x->_nsrem);
    this->_logZ = x->_logZ;
  }
  return this;
}

Assistant:

TreeEPSubTree & operator=( const TreeEPSubTree& x ) {
                        if( this != &x ) {
                            _Qa         = x._Qa;
                            _Qb         = x._Qb;
                            _RTree      = x._RTree;
                            _a          = x._a;
                            _b          = x._b;
                            _I          = x._I;
                            _ns         = x._ns;
                            _nsrem      = x._nsrem;
                            _logZ       = x._logZ;
                        }
                        return *this;
                    }